

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
ProxyListener::ProcessMessage(ProxyListener *this,ReceivedMessage *m,IpEndpointName *remoteEndpoint)

{
  char cVar1;
  unsigned_long uVar2;
  bool bVar3;
  int32 rhs;
  unsigned_long uVar4;
  char *pcVar5;
  size_t size;
  socklen_t in_ECX;
  UdpSocket *pUVar6;
  float rhs_00;
  const_iterator arg;
  OutboundPacketStream p;
  MidiMessage local_bc;
  ReceivedMessageArgument local_b8;
  OutboundPacketStream local_a8 [2];
  
  pUVar6 = &((this->proxy_).super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->super_UdpSocket;
  if (pUVar6 == (UdpSocket *)0x0) {
    IpEndpointName::AddressAsString(remoteEndpoint,(char *)local_a8);
    uVar2 = remoteEndpoint->address;
    uVar4 = IpEndpointName::GetHostByName("localhost");
    if (uVar2 != uVar4) {
      std::__cxx11::string::assign((char *)&this->host_);
      connect(this,(int)&this->host_,(sockaddr *)(ulong)this->port_,in_ECX);
    }
    pUVar6 = &((this->proxy_).super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_UdpSocket;
    if (pUVar6 == (UdpSocket *)0x0) {
      return;
    }
  }
  bVar3 = UdpSocket::IsBound(pUVar6);
  if (bVar3) {
    osc::OutboundPacketStream::OutboundPacketStream(local_a8,this->buffer_,0x400);
    local_b8.typeTagPtr_ = m->addressPattern_;
    osc::OutboundPacketStream::operator<<(local_a8,(BeginMessage *)&local_b8);
    local_b8.typeTagPtr_ = m->typeTagsBegin_;
    local_b8.argumentPtr_ = m->arguments_;
    while (local_b8.typeTagPtr_ != m->typeTagsEnd_) {
      cVar1 = *local_b8.typeTagPtr_;
      if (cVar1 == 'f') {
        rhs_00 = osc::ReceivedMessageArgument::AsFloat(&local_b8);
        osc::OutboundPacketStream::operator<<(local_a8,rhs_00);
      }
      else if (cVar1 == 'i') {
        rhs = osc::ReceivedMessageArgument::AsInt32(&local_b8);
        osc::OutboundPacketStream::operator<<(local_a8,rhs);
      }
      else if (cVar1 == 'm') {
        local_bc.value = osc::ReceivedMessageArgument::AsMidiMessage(&local_b8);
        osc::OutboundPacketStream::operator<<(local_a8,&local_bc);
      }
      else if (cVar1 == 's') {
        pcVar5 = osc::ReceivedMessageArgument::AsString(&local_b8);
        osc::OutboundPacketStream::operator<<(local_a8,pcVar5);
      }
      osc::ReceivedMessageArgumentIterator::operator++
                ((ReceivedMessageArgumentIterator *)&local_b8,0);
    }
    osc::OutboundPacketStream::operator<<(local_a8,(MessageTerminator *)&osc::EndMessage);
    pUVar6 = &((this->proxy_).super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_UdpSocket;
    pcVar5 = osc::OutboundPacketStream::Data(local_a8);
    size = osc::OutboundPacketStream::Size(local_a8);
    UdpSocket::Send(pUVar6,pcVar5,size);
    osc::OutboundPacketStream::~OutboundPacketStream(local_a8);
  }
  return;
}

Assistant:

void ProcessMessage(const osc::ReceivedMessage &m,
                        const IpEndpointName &remoteEndpoint) override {
        (void) remoteEndpoint; // suppress unused parameter warning

        try {
            if (!proxy_) {
                char host[128];
                remoteEndpoint.AddressAsString(host);
                if (remoteEndpoint.address == IpEndpointName("localhost").address) {
                    ;
                } else {
                    host_=host;
                    connect(host_,port_);
                }
            }
            if(!proxy_ || !proxy_->IsBound()) return;
            osc::OutboundPacketStream p(buffer_, OUTPUT_BUFFER_SIZE);

//            p << osc::BeginBundleImmediate;
            p << osc::BeginMessage(m.AddressPattern());
            osc::ReceivedMessage::const_iterator arg = m.ArgumentsBegin();
            while (arg != m.ArgumentsEnd()) {
                switch (arg->TypeTag()) {
                    case osc::INT32_TYPE_TAG : {
                        p << arg->AsInt32();
                        break;
                    };
                    case osc::FLOAT_TYPE_TAG : {
                        p << arg->AsFloat();
                        break;
                    };
                    case osc::STRING_TYPE_TAG : {
                        p << arg->AsString();
                        break;
                    };
                    case osc::MIDI_MESSAGE_TYPE_TAG : {
                        p << osc::MidiMessage(arg->AsMidiMessage());
                        break;
                    };

                    default:
                        break;
                }
                arg++;
            }


            p << osc::EndMessage;
//            p << osc::EndBundle;


            proxy_->Send(p.Data(), p.Size());
        } catch (osc::Exception &e) {
            // any parsing errors such as unexpected argument types, or
            // missing arguments get thrown as exceptions.
            std::cout << "error while parsing message: "
                      << m.AddressPattern() << ": " << e.what() << "\n";
        }


    }